

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O0

void png_init_rgb_transformations(png_structrp png_ptr)

{
  png_uint_16 pVar1;
  png_uint_16 pVar2;
  int trans_gray;
  int gray;
  int input_has_transparency;
  int input_has_alpha;
  png_structrp png_ptr_local;
  
  if ((png_ptr->color_type & 4) == 0) {
    png_ptr->transformations = png_ptr->transformations & 0xff7fffff;
    png_ptr->flags = png_ptr->flags & 0xffffdfff;
    if (png_ptr->num_trans == 0) {
      png_ptr->transformations = png_ptr->transformations & 0xfffffe7f;
    }
  }
  if ((((png_ptr->transformations & 0x100) != 0) && ((png_ptr->transformations & 0x1000) != 0)) &&
     ((png_ptr->color_type & 2) == 0)) {
    pVar1 = (png_ptr->background).gray;
    pVar2 = (png_ptr->trans_color).gray;
    switch(png_ptr->bit_depth) {
    case '\x01':
      pVar1 = pVar1 * 0xff;
      pVar2 = pVar2 * 0xff;
      break;
    case '\x02':
      pVar1 = pVar1 * 0x55;
      pVar2 = pVar2 * 0x55;
      break;
    default:
    case '\b':
    case '\x10':
      break;
    case '\x04':
      pVar1 = pVar1 * 0x11;
      pVar2 = pVar2 * 0x11;
    }
    (png_ptr->background).blue = pVar1;
    (png_ptr->background).green = pVar1;
    (png_ptr->background).red = pVar1;
    if ((png_ptr->transformations & 0x2000000) == 0) {
      (png_ptr->trans_color).blue = pVar2;
      (png_ptr->trans_color).green = pVar2;
      (png_ptr->trans_color).red = pVar2;
    }
  }
  return;
}

Assistant:

static void /* PRIVATE */
png_init_rgb_transformations(png_structrp png_ptr)
{
   /* Added to libpng-1.5.4: check the color type to determine whether there
    * is any alpha or transparency in the image and simply cancel the
    * background and alpha mode stuff if there isn't.
    */
   int input_has_alpha = (png_ptr->color_type & PNG_COLOR_MASK_ALPHA) != 0;
   int input_has_transparency = png_ptr->num_trans > 0;

   /* If no alpha we can optimize. */
   if (input_has_alpha == 0)
   {
      /* Any alpha means background and associative alpha processing is
       * required, however if the alpha is 0 or 1 throughout OPTIMIZE_ALPHA
       * and ENCODE_ALPHA are irrelevant.
       */
#     ifdef PNG_READ_ALPHA_MODE_SUPPORTED
         png_ptr->transformations &= ~PNG_ENCODE_ALPHA;
         png_ptr->flags &= ~PNG_FLAG_OPTIMIZE_ALPHA;
#     endif

      if (input_has_transparency == 0)
         png_ptr->transformations &= ~(PNG_COMPOSE | PNG_BACKGROUND_EXPAND);
   }

#if defined(PNG_READ_EXPAND_SUPPORTED) && defined(PNG_READ_BACKGROUND_SUPPORTED)
   /* png_set_background handling - deals with the complexity of whether the
    * background color is in the file format or the screen format in the case
    * where an 'expand' will happen.
    */

   /* The following code cannot be entered in the alpha pre-multiplication case
    * because PNG_BACKGROUND_EXPAND is cancelled below.
    */
   if ((png_ptr->transformations & PNG_BACKGROUND_EXPAND) != 0 &&
       (png_ptr->transformations & PNG_EXPAND) != 0 &&
       (png_ptr->color_type & PNG_COLOR_MASK_COLOR) == 0)
       /* i.e., GRAY or GRAY_ALPHA */
   {
      {
         /* Expand background and tRNS chunks */
         int gray = png_ptr->background.gray;
         int trans_gray = png_ptr->trans_color.gray;

         switch (png_ptr->bit_depth)
         {
            case 1:
               gray *= 0xff;
               trans_gray *= 0xff;
               break;

            case 2:
               gray *= 0x55;
               trans_gray *= 0x55;
               break;

            case 4:
               gray *= 0x11;
               trans_gray *= 0x11;
               break;

            default:

            case 8:
               /* FALLTHROUGH */ /*  (Already 8 bits) */

            case 16:
               /* Already a full 16 bits */
               break;
         }

         png_ptr->background.red = png_ptr->background.green =
            png_ptr->background.blue = (png_uint_16)gray;

         if ((png_ptr->transformations & PNG_EXPAND_tRNS) == 0)
         {
            png_ptr->trans_color.red = png_ptr->trans_color.green =
               png_ptr->trans_color.blue = (png_uint_16)trans_gray;
         }
      }
   } /* background expand and (therefore) no alpha association. */
#endif /* READ_EXPAND && READ_BACKGROUND */
}